

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

void __thiscall ODDLParser::OpenDDLParser::setLogCallback(OpenDDLParser *this,logCallback callback)

{
  code *pcVar1;
  
  pcVar1 = logMessage;
  if (callback != (logCallback)0x0) {
    pcVar1 = callback;
  }
  this->m_logCallback = pcVar1;
  return;
}

Assistant:

void OpenDDLParser::setLogCallback( logCallback callback ) {
    if( ddl_nullptr != callback ) {
        // install user-specific log callback
        m_logCallback = callback;
    } else {
        // install default log callback
        m_logCallback = &logMessage;
    }
}